

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O1

CURLcode mqtt_doing(Curl_easy *data,_Bool *done)

{
  size_t *psVar1;
  smb_conn_state sVar2;
  uint uVar3;
  MQTT *pMVar4;
  curl_trc_feat *pcVar5;
  long lVar6;
  _Bool *p_Var7;
  byte bVar8;
  CURLcode CVar9;
  CURLcode CVar10;
  char *pcVar11;
  connectdata *pcVar12;
  size_t sVar13;
  long lVar14;
  long lVar15;
  connectdata *conn;
  dynbuf *pdVar16;
  uchar recvbyte;
  ssize_t nread;
  byte local_1050;
  undefined7 uStack_104f;
  connectdata *local_1048;
  _Bool *local_1040;
  long local_1038 [513];
  
  pcVar12 = data->conn;
  pMVar4 = (data->req).p.mqtt;
  *done = false;
  if (pMVar4->nsend == 0) {
    CVar9 = CURLE_OK;
  }
  else {
    pcVar11 = pMVar4->sendleftovers;
    CVar9 = mqtt_send(data,pcVar11,pMVar4->nsend);
    (*Curl_cfree)(pcVar11);
    if (CVar9 != CURLE_OK) {
      return CVar9;
    }
  }
  if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
     ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level)))) {
    Curl_infof(data,"mqtt_doing: state [%d]",(ulong)(pcVar12->proto).smbc.state);
  }
  switch((pcVar12->proto).smbc.state) {
  case SMB_NOT_CONNECTED:
    CVar9 = Curl_xfer_recv(data,(char *)&pMVar4->firstbyte,1,local_1038);
    if (CVar9 != CURLE_OK) break;
    if (local_1038[0] == 0) {
      Curl_failf(data,"Connection disconnected");
      *done = true;
      CVar9 = CURLE_RECV_ERROR;
      break;
    }
    Curl_debug(data,CURLINFO_HEADER_IN,(char *)&pMVar4->firstbyte,1);
    pMVar4->npacket = 0;
    (data->conn->proto).smbc.state = SMB_CONNECTING;
  case SMB_CONNECTING:
    local_1048 = pcVar12;
    local_1040 = done;
    while ((CVar10 = Curl_xfer_recv(data,(char *)&local_1050,1,local_1038), CVar10 == CURLE_OK &&
           (local_1038[0] != 0))) {
      Curl_debug(data,CURLINFO_HEADER_IN,(char *)&local_1050,1);
      sVar13 = pMVar4->npacket;
      pMVar4->npacket = sVar13 + 1;
      pMVar4->pkt_hd[sVar13] = local_1050;
      if ((-1 < (char)local_1050) || (3 < pMVar4->npacket)) break;
    }
    p_Var7 = local_1040;
    CVar9 = local_1050 >> 4 & CURLE_WEIRD_SERVER_REPLY;
    if (local_1038[0] == 0) {
      CVar9 = CVar10;
    }
    if (CVar10 != CURLE_OK) {
      CVar9 = CVar10;
    }
    if (CVar9 == CURLE_OK) {
      if (pMVar4->npacket == 0) {
        sVar13 = 0;
      }
      else {
        lVar14 = 1;
        lVar15 = 0x48;
        sVar13 = 0;
        do {
          lVar6 = lVar15 + -0x48;
          sVar13 = (ulong)(pMVar4->pkt_hd[lVar6] & 0x7f) * lVar14 + sVar13;
          if (pMVar4->npacket <= lVar15 - 0x47U) break;
          lVar14 = lVar14 << 7;
          lVar15 = lVar15 + 1;
        } while ((char)pMVar4->pkt_hd[lVar6] < '\0');
      }
      pMVar4->remaining_length = sVar13;
      pMVar4->npacket = 0;
      if (sVar13 == 0) {
        (data->conn->proto).ftpc.pp.nread_resp = 0;
        CVar9 = CURLE_OK;
        if (pMVar4->firstbyte == 0xe0) {
          if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
             ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
              (0 < pcVar5->log_level)))) {
            Curl_infof(data,"Got DISCONNECT");
          }
          *p_Var7 = true;
        }
      }
      else {
        sVar2 = (local_1048->proto).mqtt.nextstate;
        pcVar12 = data->conn;
        (pcVar12->proto).smbc.state = sVar2;
        CVar9 = CURLE_OK;
        if (sVar2 == SMB_NOT_CONNECTED) {
          (pcVar12->proto).mqtt.nextstate = MQTT_NOSTATE;
        }
      }
    }
    break;
  case SMB_NEGOTIATE:
    pMVar4 = (data->req).p.mqtt;
    CVar9 = mqtt_recv_atleast(data,2);
    if (CVar9 == CURLE_OK) {
      pdVar16 = &pMVar4->recvbuf;
      pcVar11 = Curl_dyn_ptr(pdVar16);
      Curl_debug(data,CURLINFO_HEADER_IN,pcVar11,2);
      if (((int)*pcVar11 == 0) && (pcVar11[1] == '\0')) {
        mqtt_recv_consume(data,2);
        CVar9 = CURLE_OK;
      }
      else {
        Curl_failf(data,"Expected %02x%02x but got %02x%02x",0,0,(ulong)(uint)(int)*pcVar11,
                   (ulong)(uint)(int)pcVar11[1]);
        Curl_dyn_reset(pdVar16);
        CVar9 = CURLE_WEIRD_SERVER_REPLY;
      }
    }
    if (CVar9 != CURLE_OK) break;
    if ((data->state).httpreq == '\x01') {
      CVar9 = mqtt_publish(data);
      if (CVar9 == CURLE_OK) {
        CVar9 = mqtt_disconnect(data);
        *done = true;
      }
      (pcVar12->proto).mqtt.nextstate = MQTT_FIRST;
      break;
    }
    CVar9 = mqtt_subscribe(data);
    if (CVar9 != CURLE_OK) break;
    pcVar12 = data->conn;
    sVar13 = 0x300000000;
LAB_00143fed:
    (pcVar12->proto).ftpc.pp.nread_resp = sVar13;
LAB_0014402c:
    CVar9 = CURLE_OK;
    break;
  case SMB_SETUP:
  case SMB_CONNECTED|SMB_CONNECTING:
  case SMB_CONNECTED|SMB_NEGOTIATE:
    pcVar12 = data->conn;
    sVar2 = (pcVar12->proto).smbc.state;
    CVar9 = CURLE_WEIRD_SERVER_REPLY;
    if (3 < sVar2 - SMB_SETUP) break;
    pMVar4 = (data->req).p.mqtt;
    switch(sVar2) {
    case SMB_CONNECTED:
switchD_00143c96_caseD_4:
      pMVar4 = (data->req).p.mqtt;
      CVar9 = mqtt_recv_atleast(data,3);
      if (CVar9 == CURLE_OK) {
        pdVar16 = &pMVar4->recvbuf;
        pcVar11 = Curl_dyn_ptr(pdVar16);
        Curl_debug(data,CURLINFO_HEADER_IN,pcVar11,3);
        uVar3 = (pcVar12->proto).mqtt.packetid;
        if (((*pcVar11 == (char)(uVar3 >> 8)) && (pcVar11[1] == (char)uVar3)) &&
           (pcVar11[2] == '\0')) {
          mqtt_recv_consume(data,3);
          CVar9 = CURLE_OK;
        }
        else {
          Curl_dyn_reset(pdVar16);
          CVar9 = CURLE_WEIRD_SERVER_REPLY;
        }
      }
      if (CVar9 != CURLE_OK) goto LAB_00144209;
      pcVar12 = data->conn;
      sVar13 = 0x500000000;
      goto LAB_00143fed;
    case SMB_CONNECTED|SMB_NEGOTIATE:
      goto switchD_00143c96_caseD_6;
    }
    bVar8 = pMVar4->firstbyte & 0xf0;
    if (bVar8 == 0xe0) {
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
         ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level))))
      {
        Curl_infof(data,"Got DISCONNECT");
      }
      *done = true;
      goto LAB_0014402c;
    }
    if (bVar8 == 0x90) {
      (pcVar12->proto).smbc.state = SMB_CONNECTED;
      goto switchD_00143c96_caseD_4;
    }
    if (bVar8 != 0x30) break;
    (pcVar12->proto).smbc.state = SMB_CONNECTED|SMB_NEGOTIATE;
    sVar13 = pMVar4->remaining_length;
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
       ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level)))) {
      Curl_infof(data,"Remaining length: %zu bytes",sVar13);
    }
    lVar14 = (data->set).max_filesize;
    if (lVar14 < (long)sVar13 && lVar14 != 0) {
      Curl_failf(data,"Maximum file size exceeded");
      CVar9 = CURLE_FILESIZE_EXCEEDED;
      break;
    }
    Curl_pgrsSetDownloadSize(data,sVar13);
    (data->req).bytecount = 0;
    (data->req).size = sVar13;
    pMVar4->npacket = sVar13;
switchD_00143c96_caseD_6:
    sVar13 = 0x1000;
    if (pMVar4->npacket < 0x1000) {
      sVar13 = pMVar4->npacket;
    }
    CVar9 = Curl_xfer_recv(data,(char *)local_1038,sVar13,(ssize_t *)&local_1050);
    if (CVar9 == CURLE_OK) {
      if (CONCAT71(uStack_104f,local_1050) != 0) {
        CVar9 = Curl_client_write(data,1,(char *)local_1038,CONCAT71(uStack_104f,local_1050));
        if (CVar9 == CURLE_OK) {
          CVar9 = CURLE_OK;
          psVar1 = &pMVar4->npacket;
          *psVar1 = *psVar1 - CONCAT71(uStack_104f,local_1050);
          if (*psVar1 == 0) {
            (data->conn->proto).tftpc = (tftp_state_data *)0x500000000;
          }
        }
        break;
      }
      CVar9 = CURLE_PARTIAL_FILE;
      if (((data == (Curl_easy *)0x0) || (((data->set).field_0x8cd & 0x10) == 0)) ||
         ((pcVar5 = (data->state).feat, pcVar5 != (curl_trc_feat *)0x0 && (pcVar5->log_level < 1))))
      break;
      pcVar11 = "server disconnected";
    }
    else {
      if ((((data == (Curl_easy *)0x0) || (CVar9 != CURLE_AGAIN)) ||
          (((data->set).field_0x8cd & 0x10) == 0)) ||
         ((pcVar5 = (data->state).feat, pcVar5 != (curl_trc_feat *)0x0 && (pcVar5->log_level < 1))))
      break;
      pcVar11 = "EEEE AAAAGAIN";
    }
    Curl_infof(data,pcVar11);
    break;
  default:
    Curl_failf(data,"State not handled yet");
    *done = true;
  }
LAB_00144209:
  CVar10 = CURLE_OK;
  if (CVar9 != CURLE_AGAIN) {
    CVar10 = CVar9;
  }
  return CVar10;
}

Assistant:

static CURLcode mqtt_doing(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct mqtt_conn *mqtt = &conn->proto.mqtt;
  struct MQTT *mq = data->req.p.mqtt;
  ssize_t nread;
  unsigned char recvbyte;

  *done = FALSE;

  if(mq->nsend) {
    /* send the remainder of an outgoing packet */
    char *ptr = mq->sendleftovers;
    result = mqtt_send(data, mq->sendleftovers, mq->nsend);
    free(ptr);
    if(result)
      return result;
  }

  infof(data, "mqtt_doing: state [%d]", (int) mqtt->state);
  switch(mqtt->state) {
  case MQTT_FIRST:
    /* Read the initial byte only */
    result = Curl_xfer_recv(data, (char *)&mq->firstbyte, 1, &nread);
    if(result)
      break;
    else if(!nread) {
      failf(data, "Connection disconnected");
      *done = TRUE;
      result = CURLE_RECV_ERROR;
      break;
    }
    Curl_debug(data, CURLINFO_HEADER_IN, (char *)&mq->firstbyte, 1);
    /* remember the first byte */
    mq->npacket = 0;
    mqstate(data, MQTT_REMAINING_LENGTH, MQTT_NOSTATE);
    FALLTHROUGH();
  case MQTT_REMAINING_LENGTH:
    do {
      result = Curl_xfer_recv(data, (char *)&recvbyte, 1, &nread);
      if(result || !nread)
        break;
      Curl_debug(data, CURLINFO_HEADER_IN, (char *)&recvbyte, 1);
      mq->pkt_hd[mq->npacket++] = recvbyte;
    } while((recvbyte & 0x80) && (mq->npacket < 4));
    if(!result && nread && (recvbyte & 0x80))
      /* MQTT supports up to 127 * 128^0 + 127 * 128^1 + 127 * 128^2 +
         127 * 128^3 bytes. server tried to send more */
      result = CURLE_WEIRD_SERVER_REPLY;
    if(result)
      break;
    mq->remaining_length = mqtt_decode_len(mq->pkt_hd, mq->npacket, NULL);
    mq->npacket = 0;
    if(mq->remaining_length) {
      mqstate(data, mqtt->nextstate, MQTT_NOSTATE);
      break;
    }
    mqstate(data, MQTT_FIRST, MQTT_FIRST);

    if(mq->firstbyte == MQTT_MSG_DISCONNECT) {
      infof(data, "Got DISCONNECT");
      *done = TRUE;
    }
    break;
  case MQTT_CONNACK:
    result = mqtt_verify_connack(data);
    if(result)
      break;

    if(data->state.httpreq == HTTPREQ_POST) {
      result = mqtt_publish(data);
      if(!result) {
        result = mqtt_disconnect(data);
        *done = TRUE;
      }
      mqtt->nextstate = MQTT_FIRST;
    }
    else {
      result = mqtt_subscribe(data);
      if(!result) {
        mqstate(data, MQTT_FIRST, MQTT_SUBACK);
      }
    }
    break;

  case MQTT_SUBACK:
  case MQTT_PUBWAIT:
  case MQTT_PUB_REMAIN:
    result = mqtt_read_publish(data, done);
    break;

  default:
    failf(data, "State not handled yet");
    *done = TRUE;
    break;
  }

  if(result == CURLE_AGAIN)
    result = CURLE_OK;
  return result;
}